

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_preserve_env(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  uv_stdio_container_t stdio [2];
  uv_pipe_t out;
  uv_stdio_container_t local_138;
  undefined4 local_128;
  undefined1 *local_120;
  undefined1 local_110 [264];
  
  init_process_options("spawn_helper7",exit_cb);
  uVar2 = uv_default_loop();
  uv_pipe_init(uVar2,local_110,0);
  local_138.flags = UV_IGNORE;
  local_128 = 0x21;
  options.stdio_count = 2;
  options.stdio = &local_138;
  local_120 = local_110;
  iVar1 = putenv("ENV_TEST=testval");
  if (iVar1 == 0) {
    options.env = (char **)0x0;
    uVar2 = uv_default_loop();
    iVar1 = uv_spawn(uVar2,&process,&options);
    if (iVar1 == 0) {
      iVar1 = uv_read_start(local_110,on_alloc,on_read);
      if (iVar1 == 0) {
        uVar2 = uv_default_loop();
        iVar1 = uv_run(uVar2,0);
        if (iVar1 == 0) {
          if (exit_cb_called == 1) {
            if (close_cb_called == 2) {
              printf("output is: %s",output);
              if (output._0_8_ == 0x6c617674736574) {
                loop = (uv_loop_t *)uv_default_loop();
                close_loop(loop);
                uVar2 = uv_default_loop();
                iVar1 = uv_loop_close(uVar2);
                if (iVar1 == 0) {
                  uv_library_shutdown();
                  return 0;
                }
                pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                uVar2 = 0x332;
              }
              else {
                pcVar3 = "strcmp(\"testval\", output) == 0";
                uVar2 = 0x330;
              }
            }
            else {
              pcVar3 = "close_cb_called == 2";
              uVar2 = 0x32d;
            }
          }
          else {
            pcVar3 = "exit_cb_called == 1";
            uVar2 = 0x32c;
          }
        }
        else {
          pcVar3 = "r == 0";
          uVar2 = 0x32a;
        }
      }
      else {
        pcVar3 = "r == 0";
        uVar2 = 0x327;
      }
    }
    else {
      pcVar3 = "r == 0";
      uVar2 = 0x324;
    }
  }
  else {
    pcVar3 = "r == 0";
    uVar2 = 0x31e;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c",
          uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(spawn_preserve_env) {
  int r;
  uv_pipe_t out;
  uv_stdio_container_t stdio[2];

  init_process_options("spawn_helper7", exit_cb);

  uv_pipe_init(uv_default_loop(), &out, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[1].data.stream = (uv_stream_t*) &out;
  options.stdio_count = 2;

  r = putenv("ENV_TEST=testval");
  ASSERT(r == 0);

  /* Explicitly set options.env to NULL to test for env clobbering. */
  options.env = NULL;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*) &out, on_alloc, on_read);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 2);

  printf("output is: %s", output);
  ASSERT(strcmp("testval", output) == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}